

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall
StringPieceUtilTestEqualsCaseInsensitiveASCII::Run
          (StringPieceUtilTestEqualsCaseInsensitiveASCII *this)

{
  Test *pTVar1;
  bool bVar2;
  StringPiece a;
  StringPiece a_00;
  StringPiece a_01;
  StringPiece a_02;
  StringPiece a_03;
  StringPiece a_04;
  StringPiece a_05;
  StringPiece b;
  StringPiece b_00;
  StringPiece b_01;
  StringPiece b_02;
  StringPiece b_03;
  StringPiece b_04;
  StringPiece b_05;
  
  pTVar1 = g_current_test;
  a.len_ = 3;
  a.str_ = "abc";
  b.len_ = 3;
  b.str_ = "abc";
  bVar2 = EqualsCaseInsensitiveASCII(a,b);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x7a,"EqualsCaseInsensitiveASCII(\"abc\", \"abc\")");
  pTVar1 = g_current_test;
  a_00.len_ = 3;
  a_00.str_ = "abc";
  b_00.len_ = 3;
  b_00.str_ = "ABC";
  bVar2 = EqualsCaseInsensitiveASCII(a_00,b_00);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x7b,"EqualsCaseInsensitiveASCII(\"abc\", \"ABC\")");
  pTVar1 = g_current_test;
  a_01.len_ = 3;
  a_01.str_ = "abc";
  b_01.len_ = 3;
  b_01.str_ = "aBc";
  bVar2 = EqualsCaseInsensitiveASCII(a_01,b_01);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x7c,"EqualsCaseInsensitiveASCII(\"abc\", \"aBc\")");
  pTVar1 = g_current_test;
  a_02.len_ = 3;
  a_02.str_ = "AbC";
  b_02.len_ = 3;
  b_02.str_ = "aBc";
  bVar2 = EqualsCaseInsensitiveASCII(a_02,b_02);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x7d,"EqualsCaseInsensitiveASCII(\"AbC\", \"aBc\")");
  pTVar1 = g_current_test;
  bVar2 = EqualsCaseInsensitiveASCII((StringPiece)ZEXT816(0x182c4c),(StringPiece)ZEXT816(0x182c4c));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x7e,"EqualsCaseInsensitiveASCII(\"\", \"\")");
  pTVar1 = g_current_test;
  a_03.len_ = 1;
  a_03.str_ = "a";
  b_03.len_ = 2;
  b_03.str_ = "ac";
  bVar2 = EqualsCaseInsensitiveASCII(a_03,b_03);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x80,"EqualsCaseInsensitiveASCII(\"a\", \"ac\")");
  pTVar1 = g_current_test;
  a_04.len_ = 1;
  a_04.str_ = "/";
  b_04.len_ = 1;
  b_04.str_ = "\\";
  bVar2 = EqualsCaseInsensitiveASCII(a_04,b_04);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x81,"EqualsCaseInsensitiveASCII(\"/\", \"\\\\\")");
  pTVar1 = g_current_test;
  a_05.len_ = 1;
  a_05.str_ = "1";
  b_05.len_ = 2;
  b_05.str_ = "10";
  bVar2 = EqualsCaseInsensitiveASCII(a_05,b_05);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x82,"EqualsCaseInsensitiveASCII(\"1\", \"10\")");
  return;
}

Assistant:

TEST(StringPieceUtilTest, EqualsCaseInsensitiveASCII) {
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "abc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "ABC"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("AbC", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("", ""));

  EXPECT_FALSE(EqualsCaseInsensitiveASCII("a", "ac"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("/", "\\"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("1", "10"));
}